

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::Branch::traceEvent(Branch *this,TraceBuilder *builder)

{
  PromiseNode *pPVar1;
  Event *pEVar2;
  
  pPVar1 = (this->promise).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])(pPVar1,builder,1);
  pEVar2 = (this->parent->onReadyEvent).event;
  if ((pEVar2 != (Event *)0x0) && (builder->current != builder->limit)) {
    (**pEVar2->_vptr_Event)(pEVar2,builder);
    return;
  }
  return;
}

Assistant:

void RaceSuccessfulPromiseNodeBase::Branch::traceEvent(TraceBuilder &builder) {
  promise->tracePromise(builder, true);
  parent.onReadyEvent.traceEvent(builder);
}